

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftadvanc.c
# Opt level: O0

FT_Error FT_Get_Advance(FT_Face face,FT_UInt gindex,FT_Int32 flags,FT_Fixed *padvance)

{
  FT_Face_GetAdvancesFunc p_Var1;
  uint uVar2;
  FT_Error FVar3;
  FT_Error error;
  FT_Face_GetAdvancesFunc func;
  FT_Fixed *padvance_local;
  FT_Int32 flags_local;
  FT_UInt gindex_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (padvance == (FT_Fixed *)0x0) {
    face_local._4_4_ = 6;
  }
  else if (gindex < (uint)face->num_glyphs) {
    p_Var1 = face->driver->clazz->get_advances;
    if ((p_Var1 != (FT_Face_GetAdvancesFunc)0x0) &&
       (((flags & 3U) != 0 || ((flags >> 0x10 & 0xfU) == 1)))) {
      uVar2 = (*p_Var1)(face,gindex,1,flags,padvance);
      if (uVar2 == 0) {
        FVar3 = _ft_face_scale_advances(face,padvance,1,flags);
        return FVar3;
      }
      if ((uVar2 & 0xff) != 7) {
        return uVar2;
      }
    }
    face_local._4_4_ = FT_Get_Advances(face,gindex,1,flags,padvance);
  }
  else {
    face_local._4_4_ = 0x10;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Advance( FT_Face    face,
                  FT_UInt    gindex,
                  FT_Int32   flags,
                  FT_Fixed  *padvance )
  {
    FT_Face_GetAdvancesFunc  func;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !padvance )
      return FT_THROW( Invalid_Argument );

    if ( gindex >= (FT_UInt)face->num_glyphs )
      return FT_THROW( Invalid_Glyph_Index );

    func = face->driver->clazz->get_advances;
    if ( func && LOAD_ADVANCE_FAST_CHECK( face, flags ) )
    {
      FT_Error  error;


      error = func( face, gindex, 1, flags, padvance );
      if ( !error )
        return _ft_face_scale_advances( face, padvance, 1, flags );

      if ( FT_ERR_NEQ( error, Unimplemented_Feature ) )
        return error;
    }

    return FT_Get_Advances( face, gindex, 1, flags, padvance );
  }